

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O0

ssize_t __thiscall ImageBox::read(ImageBox *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  ssize_t sVar2;
  size_t __nbytes_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  ImageScaleType local_1c;
  uint8_t *puStack_18;
  int tmp;
  uint8_t *buf_local;
  ImageBox *this_local;
  
  puStack_18 = (uint8_t *)CONCAT44(in_register_00000034,__fd);
  buf_local = (uint8_t *)this;
  iVar1 = Util::readInt32(puStack_18,(int *)&local_1c);
  puStack_18 = puStack_18 + iVar1;
  this->imageScaleType = local_1c;
  sVar2 = NinePatchMargin::read((int)puStack_18,&this->ninePatchMargin,__nbytes_00);
  puStack_18 = puStack_18 + (int)sVar2;
  iVar1 = Util::readString(puStack_18,&this->image);
  puStack_18 = puStack_18 + iVar1;
  sVar2 = Widget::read(&this->super_Widget,(int)puStack_18,__buf_00,(long)iVar1);
  return sVar2;
}

Assistant:

uint8_t* ImageBox::read(uint8_t* buf)
{
	int tmp;
	buf += Util::readInt32(buf, tmp);
	imageScaleType = static_cast<ImageScaleType>(tmp);
	buf += NinePatchMargin::read(buf, ninePatchMargin);
	buf += Util::readString(buf, image);
	return Widget::read(buf);
}